

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_mips.c
# Opt level: O2

int main(void)

{
  int iVar1;
  uint8_t *buffer;
  uchar *str;
  cs_detail *pcVar2;
  size_t count;
  cs_err cVar3;
  char *pcVar4;
  size_t len;
  size_t len_00;
  size_t sVar5;
  long lVar6;
  char *__format;
  long *plVar7;
  ulong uVar8;
  cs_insn *insn;
  long local_40;
  size_t local_38;
  
  lVar6 = 0;
  do {
    if (lVar6 == 4) {
      return 0;
    }
    local_40 = lVar6;
    cVar3 = cs_open(CS_ARCH_MIPS,(&DAT_00266534)[lVar6 * 8],&handle);
    if (cVar3 == CS_ERR_OK) {
      cs_option(handle,CS_OPT_DETAIL,3);
      buffer = (&PTR_anon_var_dwarf_27_00266538)[lVar6 * 4];
      str = (uchar *)(&DAT_00266540)[lVar6 * 4];
      local_38 = cs_disasm(handle,buffer,(size_t)str,0x1000,0,&insn);
      if (local_38 == 0) {
        puts("****************");
        printf("Platform: %s\n",(&PTR_anon_var_dwarf_45_00266548)[lVar6 * 4]);
        print_string_hex((char *)buffer,str,len_00);
        puts("ERROR: Failed to disasm given code!");
      }
      else {
        puts("****************");
        printf("Platform: %s\n",(&PTR_anon_var_dwarf_45_00266548)[lVar6 * 4]);
        print_string_hex((char *)buffer,str,len);
        puts("Disasm:");
        for (sVar5 = 0; count = local_38, sVar5 != local_38; sVar5 = sVar5 + 1) {
          printf("0x%lx:\t%s\t%s\n",insn[sVar5].address,insn[sVar5].mnemonic,insn[sVar5].op_str);
          pcVar2 = insn[sVar5].detail;
          if (pcVar2 != (cs_detail *)0x0) {
            if ((pcVar2->field_6).x86.prefix[0] != '\0') {
              printf("\top_count: %u\n");
            }
            plVar7 = (long *)((long)&pcVar2->field_6 + 0x18);
            for (uVar8 = 0; uVar8 < (pcVar2->field_6).x86.prefix[0]; uVar8 = uVar8 + 1) {
              iVar1 = (int)plVar7[-2];
              if (iVar1 == 3) {
                printf("\t\toperands[%u].type: MEM\n",uVar8 & 0xffffffff);
                if (*(uint *)(plVar7 + -1) != 0) {
                  pcVar4 = cs_reg_name(handle,*(uint *)(plVar7 + -1));
                  printf("\t\t\toperands[%u].mem.base: REG = %s\n",uVar8 & 0xffffffff,pcVar4);
                }
                pcVar4 = (char *)*plVar7;
                if (pcVar4 != (char *)0x0) {
                  __format = "\t\t\toperands[%u].mem.disp: 0x%lx\n";
                  goto LAB_00142426;
                }
              }
              else {
                if (iVar1 == 2) {
                  pcVar4 = (char *)plVar7[-1];
                  __format = "\t\toperands[%u].type: IMM = 0x%lx\n";
                }
                else {
                  if (iVar1 != 1) goto LAB_0014242d;
                  pcVar4 = cs_reg_name(handle,*(uint *)(plVar7 + -1));
                  __format = "\t\toperands[%u].type: REG = %s\n";
                }
LAB_00142426:
                printf(__format,uVar8 & 0xffffffff,pcVar4);
              }
LAB_0014242d:
              plVar7 = plVar7 + 3;
            }
            putchar(10);
          }
        }
        printf("0x%lx:\n",(ulong)insn[local_38 - 1].size + insn[local_38 - 1].address);
        cs_free(insn,count);
      }
      putchar(10);
      cs_close(&handle);
    }
    else {
      printf("Failed on cs_open() with error returned: %u\n",(ulong)cVar3);
    }
    lVar6 = local_40 + 1;
  } while( true );
}

Assistant:

int main()
{
	test();

	return 0;
}